

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O0

void __thiscall EventLoop::execute_task_funcs(EventLoop *this)

{
  size_type sVar1;
  reference this_00;
  ulong local_48;
  size_t i;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  EventLoop *this_local;
  
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock);
  this->el_dealing_task_funcs = true;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->el_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::swap
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock,
             &this->el_task_funcs);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                      ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                       &lock);
    if (sVar1 <= local_48) break;
    this_00 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
              operator[]((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                         )&lock,local_48);
    std::function<void_()>::operator()(this_00);
    local_48 = local_48 + 1;
  }
  this->el_dealing_task_funcs = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&lock);
  return;
}

Assistant:

void EventLoop::execute_task_funcs() {
    std::vector<Task> functors;
    el_dealing_task_funcs = true;

    {
        lock_guard<mutex> lock(el_mutex);
        functors.swap(el_task_funcs);
    }

    for (size_t i = 0; i < functors.size(); ++i) functors[i]();
    el_dealing_task_funcs = false;
}